

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

void __thiscall
spvtools::opt::Function::ForEachInst
          (Function *this,function<void_(spvtools::opt::Instruction_*)> *f,
          bool run_on_debug_line_insts,bool run_on_non_semantic_insts)

{
  anon_class_8_1_54a39806 local_48;
  function<bool_(spvtools::opt::Instruction_*)> local_40;
  byte local_1a;
  byte local_19;
  bool run_on_non_semantic_insts_local;
  function<void_(spvtools::opt::Instruction_*)> *pfStack_18;
  bool run_on_debug_line_insts_local;
  function<void_(spvtools::opt::Instruction_*)> *f_local;
  Function *this_local;
  
  local_48.f = f;
  local_1a = run_on_non_semantic_insts;
  local_19 = run_on_debug_line_insts;
  pfStack_18 = f;
  f_local = (function<void_(spvtools::opt::Instruction_*)> *)this;
  std::function<bool(spvtools::opt::Instruction*)>::
  function<spvtools::opt::Function::ForEachInst(std::function<void(spvtools::opt::Instruction*)>const&,bool,bool)::__0,void>
            ((function<bool(spvtools::opt::Instruction*)> *)&local_40,&local_48);
  WhileEachInst(this,&local_40,(bool)(local_19 & 1),(bool)(local_1a & 1));
  std::function<bool_(spvtools::opt::Instruction_*)>::~function(&local_40);
  return;
}

Assistant:

void Function::ForEachInst(const std::function<void(Instruction*)>& f,
                           bool run_on_debug_line_insts,
                           bool run_on_non_semantic_insts) {
  WhileEachInst(
      [&f](Instruction* inst) {
        f(inst);
        return true;
      },
      run_on_debug_line_insts, run_on_non_semantic_insts);
}